

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBOverrideQualifiersWithAPITest::getShaderBody
          (XFBOverrideQualifiersWithAPITest *this,GLuint test_case_index,STAGES stage,
          string *out_assignments,string *out_calculations)

{
  GLchar *text;
  Type TVar1;
  Type local_58;
  Type local_44;
  Type *local_38;
  Type *type;
  GLchar *assignments;
  string *out_calculations_local;
  string *out_assignments_local;
  STAGES stage_local;
  GLuint test_case_index_local;
  XFBOverrideQualifiersWithAPITest *this_local;
  
  assignments = (GLchar *)out_calculations;
  out_calculations_local = out_assignments;
  out_assignments_local._0_4_ = stage;
  out_assignments_local._4_4_ = test_case_index;
  _stage_local = this;
  std::__cxx11::string::operator=((string *)out_calculations,"");
  type = (Type *)anon_var_dwarf_3d91;
  if ((STAGES)out_assignments_local == GEOMETRY) {
    type = (Type *)getShaderBody::gs;
  }
  else if ((STAGES)out_assignments_local == FRAGMENT) {
    type = (Type *)getShaderBody::fs;
  }
  std::__cxx11::string::operator=((string *)out_calculations_local,(char *)type);
  if ((STAGES)out_assignments_local == FRAGMENT) {
    TVar1 = TestBase::getType((TestBase *)this,out_assignments_local._4_4_);
    local_58._0_8_ = TVar1._0_8_;
    local_44.m_basic_type = local_58.m_basic_type;
    local_44.m_n_columns = local_58.m_n_columns;
    local_58.m_n_rows = TVar1.m_n_rows;
    local_44.m_n_rows = local_58.m_n_rows;
    local_38 = &local_44;
    text = Utils::Type::GetGLSLTypeName(local_38);
    Utils::replaceAllTokens("TYPE",text,out_calculations_local);
  }
  return;
}

Assistant:

void XFBOverrideQualifiersWithAPITest::getShaderBody(GLuint test_case_index, Utils::Shader::STAGES stage,
													 std::string& out_assignments, std::string& out_calculations)
{
	out_calculations = "";

	static const GLchar* gs = "    vegeta = uni_vegeta;\n"
							  "    trunks = uni_trunks;\n"
							  "    goku   = uni_goku;\n"
							  "    gohan  = uni_gohan;\n";
	static const GLchar* fs = "    fs_out = vec4(0);\n"
							  "    if (TYPE(1) == gohan + goku + trunks + vegeta)\n"
							  "    {\n"
							  "        fs_out = vec4(1);\n"
							  "    }\n";

	const GLchar* assignments = "";
	switch (stage)
	{
	case Utils::Shader::FRAGMENT:
		assignments = fs;
		break;
	case Utils::Shader::GEOMETRY:
		assignments = gs;
		break;
	default:
		break;
	}

	out_assignments = assignments;

	if (Utils::Shader::FRAGMENT == stage)
	{
		const Utils::Type& type = getType(test_case_index);

		Utils::replaceAllTokens("TYPE", type.GetGLSLTypeName(), out_assignments);
	}
}